

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordQueryReliablePdu.cpp
# Opt level: O0

void __thiscall
DIS::RecordQueryReliablePdu::unmarshal(RecordQueryReliablePdu *this,DataStream *dataStream)

{
  undefined1 local_30 [8];
  FourByteChunk x;
  size_t idx;
  DataStream *dataStream_local;
  RecordQueryReliablePdu *this_local;
  
  SimulationManagementWithReliabilityFamilyPdu::unmarshal
            (&this->super_SimulationManagementWithReliabilityFamilyPdu,dataStream);
  DataStream::operator>>(dataStream,&this->_requestID);
  DataStream::operator>>(dataStream,&this->_requiredReliabilityService);
  DataStream::operator>>(dataStream,&this->_pad1);
  DataStream::operator>>(dataStream,&this->_pad2);
  DataStream::operator>>(dataStream,&this->_eventType);
  DataStream::operator>>(dataStream,&this->_time);
  DataStream::operator>>(dataStream,&this->_numberOfRecords);
  std::vector<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>::clear(&this->_recordIDs);
  x._otherParameters[0] = '\0';
  x._otherParameters[1] = '\0';
  x._otherParameters[2] = '\0';
  x._otherParameters[3] = '\0';
  x._12_4_ = 0;
  for (; (ulong)x._8_8_ < (ulong)this->_numberOfRecords; x._8_8_ = x._8_8_ + 1) {
    FourByteChunk::FourByteChunk((FourByteChunk *)local_30);
    FourByteChunk::unmarshal((FourByteChunk *)local_30,dataStream);
    std::vector<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>::push_back
              (&this->_recordIDs,(value_type *)local_30);
    FourByteChunk::~FourByteChunk((FourByteChunk *)local_30);
  }
  return;
}

Assistant:

void RecordQueryReliablePdu::unmarshal(DataStream& dataStream)
{
    SimulationManagementWithReliabilityFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    dataStream >> _requestID;
    dataStream >> _requiredReliabilityService;
    dataStream >> _pad1;
    dataStream >> _pad2;
    dataStream >> _eventType;
    dataStream >> _time;
    dataStream >> _numberOfRecords;

     _recordIDs.clear();
     for(size_t idx = 0; idx < _numberOfRecords; idx++)
     {
        FourByteChunk x;
        x.unmarshal(dataStream);
        _recordIDs.push_back(x);
     }
}